

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::enforceOk
          (BasicResult<Catch::clara::detail::ParseResultType> *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 8) != 0) {
    abort();
  }
  return;
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }